

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLtree.c
# Opt level: O1

int htmlNodeDumpFileFormat(FILE *out,xmlDocPtr doc,xmlNodePtr cur,char *encoding,int format)

{
  int iVar1;
  xmlCharEncodingHandler *encoder;
  xmlOutputBufferPtr buf;
  
  xmlInitParser();
  encoder = htmlFindOutputEncoder(encoding);
  buf = xmlOutputBufferCreateFile(out,encoder);
  if (buf != (xmlOutputBufferPtr)0x0) {
    htmlNodeDumpFormatOutput(buf,doc,cur,(char *)0x0,format);
    iVar1 = xmlOutputBufferClose(buf);
    return iVar1;
  }
  return 0;
}

Assistant:

int
htmlNodeDumpFileFormat(FILE *out, xmlDocPtr doc,
	               xmlNodePtr cur, const char *encoding, int format) {
    xmlOutputBufferPtr buf;
    xmlCharEncodingHandlerPtr handler;
    int ret;

    xmlInitParser();

    /*
     * save the content to a temp buffer.
     */
    handler = htmlFindOutputEncoder(encoding);
    buf = xmlOutputBufferCreateFile(out, handler);
    if (buf == NULL)
        return(0);

    htmlNodeDumpFormatOutput(buf, doc, cur, NULL, format);

    ret = xmlOutputBufferClose(buf);
    return(ret);
}